

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_parser.cpp
# Opt level: O2

void __thiscall
ClParser_StringFromSet_Test::~ClParser_StringFromSet_Test(ClParser_StringFromSet_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ClParser, StringFromSet) {
    using pstore::maybe;
    using pstore::command_line::parser;

    parser<std::string> p;
    p.add_literal_option ("a", 31, "description a");
    p.add_literal_option ("b", 37, "description b");

    {
        maybe<std::string> r1 = p ("hello");
        EXPECT_FALSE (r1.has_value ());
    }
    {
        maybe<std::string> r2 = p ("a");
        EXPECT_TRUE (r2.has_value ());
        EXPECT_EQ (r2.value (), "a");
    }
    {
        maybe<std::string> r3 = p ("b");
        EXPECT_TRUE (r3.has_value ());
        EXPECT_EQ (r3.value (), "b");
    }
}